

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O0

void avro::codec_traits<testgen::_bigrecord_Union__0__>::decode(Decoder *d,_bigrecord_Union__0__ *v)

{
  _bigrecord_Union__0__ *this;
  undefined8 uVar1;
  long *in_RDI;
  float vv_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vv;
  size_t n;
  string *in_stack_ffffffffffffff58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *t;
  Exception *in_stack_ffffffffffffff60;
  _Base_ptr in_stack_ffffffffffffff90;
  _Base_ptr in_stack_ffffffffffffff98;
  _Base_ptr in_stack_ffffffffffffffa0;
  
  this = (_bigrecord_Union__0__ *)(**(code **)(*in_RDI + 0xb0))();
  if (this < (_bigrecord_Union__0__ *)0x3) {
    if (this == (_bigrecord_Union__0__ *)0x0) {
      (**(code **)(*in_RDI + 0x18))();
      testgen::_bigrecord_Union__0__::set_null(this);
    }
    else if (this == (_bigrecord_Union__0__ *)0x1) {
      t = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)&stack0xffffffffffffff80;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)0x2c5053);
      decode<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                ((Decoder *)this,t);
      testgen::_bigrecord_Union__0__::set_map(this,t);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)0x2c5084);
    }
    else if (this == (_bigrecord_Union__0__ *)0x2) {
      decode<float>((Decoder *)0x2,(float *)in_stack_ffffffffffffff58);
      testgen::_bigrecord_Union__0__::set_float(this,(float *)in_stack_ffffffffffffff58);
    }
    return;
  }
  uVar1 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             (allocator<char> *)in_stack_ffffffffffffff90);
  Exception::Exception(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void decode(Decoder& d, testgen::_bigrecord_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 3) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                std::map<std::string, int32_t > vv;
                avro::decode(d, vv);
                v.set_map(vv);
            }
            break;
        case 2:
            {
                float vv;
                avro::decode(d, vv);
                v.set_float(vv);
            }
            break;
        }
    }